

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipkincore_types.cpp
# Opt level: O3

void __thiscall
twitter::zipkin::thrift::BinaryAnnotation::BinaryAnnotation
          (BinaryAnnotation *this,BinaryAnnotation *other5)

{
  _Endpoint__isset *p_Var1;
  
  *(undefined ***)this = &PTR__BinaryAnnotation_00268928;
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  (this->key)._M_string_length = 0;
  (this->key).field_2._M_local_buf[0] = '\0';
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  (this->value)._M_string_length = 0;
  (this->value).field_2._M_local_buf[0] = '\0';
  *(undefined ***)&this->host = &PTR__Endpoint_00268858;
  (this->host).ipv4 = 0;
  (this->host).port = 0;
  (this->host).service_name._M_dataplus._M_p = (pointer)&(this->host).service_name.field_2;
  (this->host).service_name._M_string_length = 0;
  (this->host).service_name.field_2._M_local_buf[0] = '\0';
  (this->host).ipv6._M_dataplus._M_p = (pointer)&(this->host).ipv6.field_2;
  (this->host).ipv6._M_string_length = 0;
  (this->host).ipv6.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->host).__isset;
  *p_Var1 = (_Endpoint__isset)((byte)*p_Var1 & 0xf0);
  this->__isset = (_BinaryAnnotation__isset)((byte)this->__isset & 0xf0);
  std::__cxx11::string::_M_assign((string *)&this->key);
  std::__cxx11::string::_M_assign((string *)&this->value);
  this->annotation_type = other5->annotation_type;
  (this->host).ipv4 = (other5->host).ipv4;
  (this->host).port = (other5->host).port;
  std::__cxx11::string::_M_assign((string *)&(this->host).service_name);
  std::__cxx11::string::_M_assign((string *)&(this->host).ipv6);
  (this->host).__isset = (other5->host).__isset;
  this->__isset = other5->__isset;
  return;
}

Assistant:

BinaryAnnotation::BinaryAnnotation(const BinaryAnnotation& other5) {
  key = other5.key;
  value = other5.value;
  annotation_type = other5.annotation_type;
  host = other5.host;
  __isset = other5.__isset;
}